

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O2

void CmdCommandPrint(Abc_Frame_t *pAbc,int fPrintAll,int fDetails)

{
  st__table *table;
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  Abc_Command **ppC1;
  st__generator *gen;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  ulong __nmemb;
  FILE *pFVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Abc_Command *pAVar11;
  Abc_Command **ppAVar12;
  char *pcVar13;
  bool bVar14;
  uint local_70;
  ulong local_68;
  char *value;
  char *key;
  
  table = pAbc->tCommands;
  pFVar1 = pAbc->Err;
  ppC1 = (Abc_Command **)malloc((long)table->num_entries << 3);
  gen = st__init_gen(table);
  local_68 = 0;
  while( true ) {
    iVar2 = st__gen(gen,&key,&value);
    __nmemb = local_68 & 0xffffffff;
    if (iVar2 == 0) break;
    if ((fPrintAll != 0) || (**(char **)value != '_')) {
      local_68 = local_68 + 1;
      ppC1[__nmemb] = (Abc_Command *)value;
    }
  }
  st__free_gen(gen);
  qsort(ppC1,__nmemb,8,CmdCommandPrintCompare);
  iVar2 = CmdCommandPrintCompare(ppC1,ppC1 + (__nmemb - 1));
  if (0 < iVar2) {
    __assert_fail("CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cmd/cmdUtils.c"
                  ,0x245,"void CmdCommandPrint(Abc_Frame_t *, int, int)");
  }
  uVar8 = local_68;
  uVar9 = 0;
  ppAVar12 = ppC1;
  while( true ) {
    bVar14 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar14) break;
    sVar4 = strlen((*ppAVar12)->sName);
    uVar5 = sVar4 & 0xffffffff;
    if ((int)sVar4 < (int)uVar9) {
      uVar5 = uVar9;
    }
    ppAVar12 = ppAVar12 + 1;
    uVar9 = uVar5;
  }
  fprintf((FILE *)pAbc->Out,"      Welcome to ABC compiled on %s %s!","May  2 2025","21:56:50");
  pAbc->Err = pAbc->Out;
  uVar8 = 0;
  local_70 = 0;
  pcVar13 = (char *)0x0;
  iVar2 = 0;
  do {
    if (uVar8 == __nmemb) {
      pFVar7 = (FILE *)pAbc->Out;
      if ((fDetails != 0) && ((uint)local_68 != local_70)) {
        fputc(10,pFVar7);
        for (lVar10 = (long)(int)local_70; pFVar7 = (FILE *)pAbc->Out, lVar10 < (long)__nmemb;
            lVar10 = lVar10 + 1) {
          fputc(10,pFVar7);
          pcVar13 = ppC1[lVar10]->sName;
          sVar4 = strlen(pcVar13);
          pcVar6 = (char *)malloc(sVar4 + 4);
          sprintf(pcVar6,"%s -h",pcVar13);
          Cmd_CommandExecute(pAbc,pcVar6);
          free(pcVar6);
        }
      }
      pAbc->Err = pFVar1;
      fputc(10,pFVar7);
      free(ppC1);
      return;
    }
    if (pcVar13 == (char *)0x0) {
      pFVar7 = (FILE *)pAbc->Out;
LAB_0028a306:
      if ((fDetails != 0) && (uVar8 != local_70)) {
        lVar10 = (long)(int)local_70;
        fputc(10,pFVar7);
        for (; fputc(10,(FILE *)pAbc->Out), lVar10 < (long)uVar8; lVar10 = lVar10 + 1) {
          pcVar13 = ppC1[lVar10]->sName;
          sVar4 = strlen(pcVar13);
          pcVar6 = (char *)malloc(sVar4 + 4);
          sprintf(pcVar6,"%s -h",pcVar13);
          Cmd_CommandExecute(pAbc,pcVar6);
          free(pcVar6);
        }
        fwrite("   ----------------------------------------------------------------------",0x49,1,
               (FILE *)pAbc->Out);
        pFVar7 = (FILE *)pAbc->Out;
        local_70 = (uint)uVar8;
      }
      fputc(10,pFVar7);
      fputc(10,(FILE *)pAbc->Out);
      fprintf((FILE *)pAbc->Out,"%s commands:\n",ppC1[uVar8]->sGroup);
      fprintf((FILE *)pAbc->Out," %-*s",uVar9,ppC1[uVar8]->sName);
      pcVar13 = ppC1[uVar8]->sGroup;
      iVar2 = 1;
    }
    else {
      pAVar11 = ppC1[uVar8];
      iVar3 = strcmp(pcVar13,pAVar11->sGroup);
      pFVar7 = (FILE *)pAbc->Out;
      if (iVar3 != 0) goto LAB_0028a306;
      if (iVar2 % (int)(0x4f / (ulong)((int)uVar9 + 2)) == 0) {
        fputc(10,pFVar7);
        pFVar7 = (FILE *)pAbc->Out;
        pAVar11 = ppC1[uVar8];
      }
      iVar2 = iVar2 + 1;
      fprintf(pFVar7," %-*s",uVar9,pAVar11->sName);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void CmdCommandPrint( Abc_Frame_t * pAbc, int fPrintAll, int fDetails )
{
    const char *key;
    char *value;
    st__generator * gen;
    Abc_Command ** ppCommands;
    Abc_Command * pCommands;
    int nCommands, iGroupStart, i, j;
    char * sGroupCur;
    int LenghtMax, nColumns, iCom = 0;
    FILE *backupErr = pAbc->Err;

    // put all commands into one array
    nCommands = st__count( pAbc->tCommands );
    ppCommands = ABC_ALLOC( Abc_Command *, nCommands );
    i = 0;
    st__foreach_item( pAbc->tCommands, gen, &key, &value )
    {
        pCommands = (Abc_Command *)value;
        if ( fPrintAll || pCommands->sName[0] != '_' )
            ppCommands[i++] = pCommands;
    }
    nCommands = i;

    // sort command by group and then by name, alphabetically
    qsort( (void *)ppCommands, nCommands, sizeof(Abc_Command *), 
            (int (*)(const void *, const void *)) CmdCommandPrintCompare );
    assert( CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0 );

    // get the longest command name
    LenghtMax = 0;
    for ( i = 0; i < nCommands; i++ )
        if ( LenghtMax < (int)strlen(ppCommands[i]->sName) )
             LenghtMax = (int)strlen(ppCommands[i]->sName); 
    // get the number of columns
    nColumns = 79 / (LenghtMax + 2);

    // print the starting message 
    fprintf( pAbc->Out, "      Welcome to ABC compiled on %s %s!", __DATE__, __TIME__ );

    // print the command by group
    sGroupCur = NULL;
    iGroupStart = 0;
    pAbc->Err = pAbc->Out;
    for ( i = 0; i < nCommands; i++ )
        if ( sGroupCur && strcmp( sGroupCur, ppCommands[i]->sGroup ) == 0 )
        { // this command belongs to the same group as the previous one
            if ( iCom++ % nColumns == 0 )
                fprintf( pAbc->Out, "\n" ); 
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
        }
        else
        { // this command starts the new group of commands
            // start the new group
            if ( fDetails && i != iGroupStart )
            { // print help messages for all commands in the previous groups
                fprintf( pAbc->Out, "\n" );
                for ( j = iGroupStart; j < i; j++ )
                {
                    char *tmp_cmd;
                    fprintf( pAbc->Out, "\n" );
                    // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
                    tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
                    (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
                    (void) Cmd_CommandExecute( pAbc, tmp_cmd );
                    ABC_FREE(tmp_cmd);
                }
                fprintf( pAbc->Out, "\n" );
                fprintf( pAbc->Out, "   ----------------------------------------------------------------------" );
                iGroupStart = i;
            }
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "%s commands:\n", ppCommands[i]->sGroup );
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
            // remember current command group
            sGroupCur = ppCommands[i]->sGroup;
            // reset the command counter
            iCom = 1;
        }
    if ( fDetails && i != iGroupStart )
    { // print help messages for all commands in the previous groups
        fprintf( pAbc->Out, "\n" );
        for ( j = iGroupStart; j < i; j++ )
        {
            char *tmp_cmd;
            fprintf( pAbc->Out, "\n" );
            // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
            tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
            (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
            (void) Cmd_CommandExecute( pAbc, tmp_cmd );
            ABC_FREE(tmp_cmd);
        }
    }
    pAbc->Err = backupErr;
    fprintf( pAbc->Out, "\n" );
    ABC_FREE( ppCommands );
}